

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

size_t BIT_initCStream(BIT_CStream_t *bitC,void *startPtr,size_t dstCapacity)

{
  size_t dstCapacity_local;
  void *startPtr_local;
  BIT_CStream_t *bitC_local;
  size_t local_8;
  
  bitC->bitContainer = 0;
  bitC->bitPos = 0;
  bitC->startPtr = (char *)startPtr;
  bitC->ptr = bitC->startPtr;
  bitC->endPtr = bitC->startPtr + (dstCapacity - 8);
  if (dstCapacity < 9) {
    local_8 = 0xffffffffffffffba;
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

MEM_STATIC size_t BIT_initCStream(BIT_CStream_t* bitC,
                                  void* startPtr, size_t dstCapacity)
{
    bitC->bitContainer = 0;
    bitC->bitPos = 0;
    bitC->startPtr = (char*)startPtr;
    bitC->ptr = bitC->startPtr;
    bitC->endPtr = bitC->startPtr + dstCapacity - sizeof(bitC->bitContainer);
    if (dstCapacity <= sizeof(bitC->bitContainer)) return ERROR(dstSize_tooSmall);
    return 0;
}